

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

enable_if_t<HasSize<vector<Point2<float>_>_>::value_&&_HasData<vector<Point2<float>_>_>::value,_std::ostream_&>
 pbrt::detail::operator<<
           (ostream *os,vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> *v)

{
  pointer pPVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  pointer v_00;
  
  std::operator<<(os,"[ ");
  pPVar1 = (v->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  v_00 = pPVar1;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(v->
                            super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pbrt::operator<<(os,v_00);
    pPVar1 = (v->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar3 < ((long)(v->
                       super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) - 1U) {
      std::operator<<(os,", ");
      pPVar1 = (v->super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
    }
    v_00 = v_00 + 1;
  }
  poVar2 = std::operator<<(os," ]");
  return poVar2;
}

Assistant:

inline std::enable_if_t<HasSize<T>::value && HasData<T>::value, std::ostream &>
operator<<(std::ostream &os, const T &v) {
    os << "[ ";
    auto ptr = v.data();
    for (size_t i = 0; i < v.size(); ++i) {
        os << ptr[i];
        if (i < v.size() - 1)
            os << ", ";
    }
    return os << " ]";
}